

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void laguerre_ss_compute(int order,double *xtab,double *weight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  double local_68;
  double x;
  double r1;
  double prod;
  double p1;
  double dStack_40;
  int i;
  double dp2;
  double cc;
  double *c;
  double *b;
  double *weight_local;
  double *xtab_local;
  int order_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)order;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  b = weight;
  weight_local = xtab;
  xtab_local._4_4_ = order;
  c = (double *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)xtab_local._4_4_;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  cc = (double)operator_new__(uVar3);
  for (p1._4_4_ = 0; p1._4_4_ < xtab_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    c[p1._4_4_] = (double)(p1._4_4_ * 2 + 1);
  }
  for (p1._4_4_ = 0; p1._4_4_ < xtab_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    *(double *)((long)cc + (long)p1._4_4_ * 8) = (double)(p1._4_4_ * p1._4_4_);
  }
  r1 = 1.0;
  for (p1._4_4_ = 1; p1._4_4_ < xtab_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    r1 = r1 * *(double *)((long)cc + (long)p1._4_4_ * 8);
  }
  dp2 = r1;
  for (p1._4_4_ = 0; p1._4_4_ < xtab_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    if (p1._4_4_ == 0) {
      local_68 = 3.0 / ((double)xtab_local._4_4_ * 2.4 + 1.0);
    }
    else {
      if (p1._4_4_ == 1) {
        dVar4 = 15.0 / ((double)xtab_local._4_4_ * 2.5 + 1.0);
      }
      else {
        x = ((double)(p1._4_4_ + -1) * 2.55 + 1.0) / ((double)(p1._4_4_ + -1) * 1.9);
        dVar4 = x * (local_68 - weight_local[p1._4_4_ + -2]);
      }
      local_68 = local_68 + dVar4;
    }
    laguerre_ss_root(&local_68,xtab_local._4_4_,&stack0xffffffffffffffc0,&prod,c,(double *)cc);
    weight_local[p1._4_4_] = local_68;
    b[p1._4_4_] = (dp2 / dStack_40) / prod;
  }
  if (c != (double *)0x0) {
    operator_delete__(c);
  }
  if (cc != 0.0) {
    operator_delete__((void *)cc);
  }
  return;
}

Assistant:

void laguerre_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_SS_COMPUTE computes a Gauss-Laguerre quadrature rule.
//
//  Discussion:
//
//    If the integral is:
//
//      Integral ( 0 <= X < +oo ) EXP ( - X ) * F(X) dX
//
//    then the quadrature rule is:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    If the integral is:
//
//      Integral ( A <= X < +oo ) F(X) dX
//
//    then the quadrature rule is:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * EXP(XTAB(I)) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the quadrature rule to be computed.
//    ORDER must be at least 1.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double *b;
  double *c;
  double cc;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double x;

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 0; i < order; i++ )
  {
    b[i] = double( 2 * i + 1 );
  }

  for ( i = 0; i < order; i++ )
  {
    c[i] = double( i * i );
  }
  prod = 1.0;
  for ( i = 1; i < order; i++ )
  {
    prod = prod * c[i];
  }
  cc = prod;

  for ( i = 0; i < order; i++ )
  {
//
//  Compute an estimate for the root.
//
    if ( i == 0 )
    {
      x =  3.0 / ( 1.0 + 2.4 * double( order ) );
    }
    else if ( i == 1 )
    {
      x = x + 15.0 / ( 1.0 + 2.5 * double( order ) );
    }
    else
    {
      r1 = ( 1.0 + 2.55 * double( i - 1 ) ) 
        / ( 1.9 * double( i - 1 ) );

      x = x + r1 * ( x - xtab[i-2] );
    }
//
//  Use iteration to find the root.
//
    laguerre_ss_root ( &x, order, &dp2, &p1, b, c );
//
//  Set the abscissa and weight.
//
    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;
  }

  delete [] b;
  delete [] c;

  return;
}